

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

_Bool duckdb_je_background_thread_stats_read(tsdn_t *tsdn,background_thread_stats_t *stats)

{
  nstime_t *time;
  nstime_t *b;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  nstime_t *a;
  uint uVar3;
  witness_comp_t *pwVar4;
  void *pvVar5;
  witness_t *pwVar6;
  ulong uVar7;
  bool bVar8;
  background_thread_info_t *pbVar9;
  atomic_b_t aVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  mutex_prof_data_t *data;
  pthread_mutex_t *__mutex;
  uint64_t local_60;
  
  iVar11 = pthread_mutex_trylock
                     ((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  if (iVar11 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&duckdb_je_background_thread_lock);
    duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  aVar10.repr = duckdb_je_background_thread_enabled_state.repr;
  duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner != tsdn) {
    duckdb_je_background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)
         (duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  if ((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) {
    time = &stats->run_interval;
    duckdb_je_nstime_copy(time,&nstime_zero);
    (stats->max_counter_per_bg_thd).prev_owner = (tsdn_t *)0x0;
    (stats->max_counter_per_bg_thd).n_lock_ops = 0;
    (stats->max_counter_per_bg_thd).max_n_thds = 0;
    (stats->max_counter_per_bg_thd).n_waiting_thds = 0;
    (stats->max_counter_per_bg_thd).n_owner_switches = 0;
    (stats->max_counter_per_bg_thd).n_wait_times = 0;
    (stats->max_counter_per_bg_thd).n_spin_acquired = 0;
    (stats->max_counter_per_bg_thd).tot_wait_time.ns = 0;
    (stats->max_counter_per_bg_thd).max_wait_time.ns = 0;
    stats->num_threads = duckdb_je_n_background_threads;
    if (duckdb_je_max_background_threads == 0) {
      stats->num_runs = 0;
    }
    else {
      b = &(stats->max_counter_per_bg_thd).max_wait_time;
      local_60 = 0;
      uVar12 = 0;
      uVar13 = 1;
      do {
        pbVar9 = duckdb_je_background_thread_info;
        __mutex = (pthread_mutex_t *)
                  ((long)&duckdb_je_background_thread_info[uVar12].mtx.field_0 + 0x48);
        iVar11 = pthread_mutex_trylock(__mutex);
        if (iVar11 == 0) {
          puVar1 = &pbVar9[uVar12].mtx.field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if (pbVar9[uVar12].mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
            pbVar9[uVar12].mtx.field_0.field_0.prof_data.prev_owner = tsdn;
            ppwVar2 = &pbVar9[uVar12].mtx.field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
          if (pbVar9[uVar12].state != background_thread_stopped) {
            local_60 = local_60 + pbVar9[uVar12].tot_n_runs;
            duckdb_je_nstime_add(time,&pbVar9[uVar12].tot_sleep_time);
            iVar11 = duckdb_je_nstime_compare
                               ((nstime_t *)&pbVar9[uVar12].mtx,
                                &(stats->max_counter_per_bg_thd).tot_wait_time);
            if (0 < iVar11) {
              duckdb_je_nstime_copy
                        (&(stats->max_counter_per_bg_thd).tot_wait_time,
                         (nstime_t *)&pbVar9[uVar12].mtx);
            }
            a = &pbVar9[uVar12].mtx.field_0.field_0.prof_data.max_wait_time;
            iVar11 = duckdb_je_nstime_compare(a,b);
            if (0 < iVar11) {
              duckdb_je_nstime_copy(b,a);
            }
            pwVar4 = pbVar9[uVar12].mtx.field_0.witness.comp;
            if ((witness_comp_t *)(stats->max_counter_per_bg_thd).n_wait_times < pwVar4) {
              (stats->max_counter_per_bg_thd).n_wait_times = (uint64_t)pwVar4;
            }
            pvVar5 = pbVar9[uVar12].mtx.field_0.witness.opaque;
            if ((void *)(stats->max_counter_per_bg_thd).n_spin_acquired < pvVar5) {
              (stats->max_counter_per_bg_thd).n_spin_acquired = (uint64_t)pvVar5;
            }
            uVar3 = *(uint *)((long)&pbVar9[uVar12].mtx.field_0 + 0x20);
            if ((stats->max_counter_per_bg_thd).max_n_thds < uVar3) {
              (stats->max_counter_per_bg_thd).max_n_thds = uVar3;
            }
            pwVar6 = pbVar9[uVar12].mtx.field_0.witness.link.qre_prev;
            if ((witness_t *)(stats->max_counter_per_bg_thd).n_owner_switches < pwVar6) {
              (stats->max_counter_per_bg_thd).n_owner_switches = (uint64_t)pwVar6;
            }
            uVar7 = pbVar9[uVar12].mtx.field_0.field_0.prof_data.n_lock_ops;
            if ((stats->max_counter_per_bg_thd).n_lock_ops < uVar7) {
              (stats->max_counter_per_bg_thd).n_lock_ops = uVar7;
            }
          }
          pbVar9[uVar12].mtx.field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(__mutex);
        }
        bVar8 = uVar13 < duckdb_je_max_background_threads;
        uVar12 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (bVar8);
      stats->num_runs = local_60;
      if (local_60 != 0) {
        duckdb_je_nstime_idivide(time,local_60);
      }
    }
  }
  duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  return (_Bool)(~aVar10.repr & 1);
}

Assistant:

bool
background_thread_stats_read(tsdn_t *tsdn, background_thread_stats_t *stats) {
	assert(config_stats);
	malloc_mutex_lock(tsdn, &background_thread_lock);
	if (!background_thread_enabled()) {
		malloc_mutex_unlock(tsdn, &background_thread_lock);
		return true;
	}

	nstime_init_zero(&stats->run_interval);
	memset(&stats->max_counter_per_bg_thd, 0, sizeof(mutex_prof_data_t));

	uint64_t num_runs = 0;
	stats->num_threads = n_background_threads;
	for (unsigned i = 0; i < max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		if (malloc_mutex_trylock(tsdn, &info->mtx)) {
			/*
			 * Each background thread run may take a long time;
			 * avoid waiting on the stats if the thread is active.
			 */
			continue;
		}
		if (info->state != background_thread_stopped) {
			num_runs += info->tot_n_runs;
			nstime_add(&stats->run_interval, &info->tot_sleep_time);
			malloc_mutex_prof_max_update(tsdn,
			    &stats->max_counter_per_bg_thd, &info->mtx);
		}
		malloc_mutex_unlock(tsdn, &info->mtx);
	}
	stats->num_runs = num_runs;
	if (num_runs > 0) {
		nstime_idivide(&stats->run_interval, num_runs);
	}
	malloc_mutex_unlock(tsdn, &background_thread_lock);

	return false;
}